

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O1

void absl::lts_20250127::base_internal::anon_unknown_0::CreateGlobalArenas(void)

{
  LowLevelAlloc::Arena::Arena
            ((Arena *)base_internal::(anonymous_namespace)::default_arena_storage,1);
  LowLevelAlloc::Arena::Arena
            ((Arena *)base_internal::(anonymous_namespace)::unhooked_arena_storage,0);
  LowLevelAlloc::Arena::Arena
            ((Arena *)base_internal::(anonymous_namespace)::unhooked_async_sig_safe_arena_storage,2)
  ;
  return;
}

Assistant:

void CreateGlobalArenas() {
  new (&default_arena_storage)
      LowLevelAlloc::Arena(LowLevelAlloc::kCallMallocHook);
  new (&unhooked_arena_storage) LowLevelAlloc::Arena(0);
#ifndef ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
  new (&unhooked_async_sig_safe_arena_storage)
      LowLevelAlloc::Arena(LowLevelAlloc::kAsyncSignalSafe);
#endif
}